

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play-full.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  mapped_type *pmVar4;
  undefined8 uVar5;
  uint uVar6;
  allocator<char> local_2a1;
  SDL_AudioSpec playbackSpec;
  SDL_AudioSpec obtainedSpec;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  ifstream fin;
  int aiStack_210 [122];
  
  printf("Usage: %s input.kbd [-pN]\n",*argv);
  puts("    -pN - select playback device N");
  putchar(10);
  if (argc < 2) {
    return -0x7f;
  }
  parseCmdArguments_abi_cxx11_(&argm,argc,argv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fin,"p",(allocator<char> *)&obtainedSpec);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&argm,(key_type *)&fin);
  if (pmVar4->_M_string_length == 0) {
    uVar1 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&playbackSpec,"p",&local_2a1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&argm,(key_type *)&playbackSpec);
    uVar1 = std::__cxx11::stoi(pmVar4,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&playbackSpec);
  }
  std::__cxx11::string::~string((string *)&fin);
  std::ifstream::ifstream(&fin,argv[1],_S_bin);
  if (*(int *)((long)aiStack_210 + *(long *)(_fin + -0x18)) == 0) {
    iVar2 = SDL_Init(0x10);
    if (-1 < iVar2) {
      uVar3 = SDL_GetNumAudioDevices(0);
      printf("Found %d playback devices:\n",(ulong)uVar3);
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        uVar5 = SDL_GetAudioDeviceName(uVar6,0);
        printf("    - Playback device #%d: \'%s\'\n",(ulong)uVar6,uVar5);
      }
      SDL_memset(&playbackSpec,0,0x20);
      playbackSpec.freq = 16000;
      playbackSpec.format = 0x8120;
      playbackSpec.channels = '\x01';
      playbackSpec.samples = 0x200;
      playbackSpec.callback = cbPlayback;
      playbackSpec.userdata = &fin;
      SDL_memset(&obtainedSpec,0,0x20);
      uVar5 = SDL_GetAudioDeviceName(uVar1,0);
      printf("Attempt to open playback device %d : \'%s\' ...\n",(ulong)uVar1,uVar5);
      uVar5 = SDL_GetAudioDeviceName(uVar1,0);
      iVar2 = SDL_OpenAudioDevice(uVar5,0,&playbackSpec,&obtainedSpec,4);
      if (iVar2 == 0) {
        uVar5 = SDL_GetError();
        SDL_LogError(0,"Couldn\'t open an audio device for playback: %s!\n",uVar5);
        SDL_Quit();
        iVar2 = -2;
      }
      else {
        puts("Opened playback device succesfully!");
        printf("    Frequency:  %d\n",(ulong)(uint)obtainedSpec.freq);
        printf("    Format:     %d (%d bytes)\n",(ulong)obtainedSpec.format,4);
        printf("    Channels:   %d\n",(ulong)obtainedSpec.channels);
        printf("    Samples:    %d\n",(ulong)obtainedSpec.samples);
        SDL_PauseAudioDevice(iVar2,0);
        while (g_terminate == false) {
          SDL_Delay(100);
        }
        std::ifstream::close();
        iVar2 = 0;
        SDL_CloseAudio();
      }
      goto LAB_0011124d;
    }
    uVar5 = SDL_GetError();
    SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar5);
  }
  else {
    fprintf(_stderr,"Failed to open file \'%s\'\n",argv[1]);
  }
  iVar2 = -1;
LAB_0011124d:
  std::ifstream::~ifstream(&fin);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&argm._M_t);
  return iVar2;
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s input.kbd [-pN]\n", argv[0]);
    printf("    -pN - select playback device N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    std::ifstream fin(argv[1], std::ios::binary);
    if (fin.good() == false) {
        fprintf(stderr, "Failed to open file '%s'\n", argv[1]);
        return -1;
    }

    if (SDL_Init(SDL_INIT_AUDIO) < 0) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
        return -1;
    }

    int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
    printf("Found %d playback devices:\n", nDevices);
    for (int i = 0; i < nDevices; i++) {
        printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
    }

    SDL_AudioSpec playbackSpec;
    SDL_zero(playbackSpec);

    playbackSpec.freq = kSampleRate;
    playbackSpec.format = AUDIO_F32SYS;
    playbackSpec.channels = 1;
    playbackSpec.samples = kSamplesPerFrame;
    playbackSpec.callback = cbPlayback;
    playbackSpec.userdata = (void *)(&fin);

    SDL_AudioSpec obtainedSpec;
    SDL_zero(obtainedSpec);

    printf("Attempt to open playback device %d : '%s' ...\n", playbackId, SDL_GetAudioDeviceName(playbackId, SDL_FALSE));
    auto deviceIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &obtainedSpec, SDL_AUDIO_ALLOW_CHANNELS_CHANGE);
    if (!deviceIdOut) {
        SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't open an audio device for playback: %s!\n", SDL_GetError());
        SDL_Quit();
        return -2;
    }

    int sampleSize_bytes = 4; // todo

    printf("Opened playback device succesfully!\n");
    printf("    Frequency:  %d\n", obtainedSpec.freq);
    printf("    Format:     %d (%d bytes)\n", obtainedSpec.format, sampleSize_bytes);
    printf("    Channels:   %d\n", obtainedSpec.channels);
    printf("    Samples:    %d\n", obtainedSpec.samples);

    SDL_PauseAudioDevice(deviceIdOut, 0);

    while (g_terminate == false) {
        SDL_Delay(100);
    }

    fin.close();

    SDL_CloseAudio();

    return 0;
}